

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O0

void __thiscall duckdb::FSSTScanState::FSSTScanState(FSSTScanState *this,idx_t string_block_limit)

{
  FSSTScanState *in_RDI;
  buffer_ptr<void> *__new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  StringScanState::StringScanState(&in_RDI->super_StringScanState);
  (in_RDI->super_StringScanState).super_SegmentScanState._vptr_SegmentScanState =
       (_func_int **)&PTR__FSSTScanState_03510770;
  __new_size = &in_RDI->duckdb_fsst_decoder;
  shared_ptr<void,_true>::shared_ptr((shared_ptr<void,_true> *)0xabe5ae);
  in_RDI->duckdb_fsst_decoder_ptr = (void *)0x0;
  vector<unsigned_char,_true>::vector((vector<unsigned_char,_true> *)0xabe5cb);
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int>,_false>::unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int>,_false> *)0xabe5dd);
  in_RDI->bitunpack_buffer_capacity = 0;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int>,_false>::unique_ptr
            ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int>,_false> *)0xabe5f8);
  in_RDI->delta_decode_capacity = 0;
  in_RDI->all_values_inlined = false;
  ResetStoredDelta(in_RDI);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)__new_size);
  return;
}

Assistant:

explicit FSSTScanState(const idx_t string_block_limit) {
		ResetStoredDelta();
		decompress_buffer.resize(string_block_limit + 1);
	}